

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

bool __thiscall
spvtools::Optimizer::Run
          (Optimizer *this,uint32_t *original_binary,size_t original_binary_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary,
          ValidatorOptions *validator_options,bool skip_validation)

{
  bool bVar1;
  spv_optimizer_options options;
  
  options = spvOptimizerOptionsCreate();
  spvOptimizerOptionsSetRunValidator(options,!skip_validation);
  spvOptimizerOptionsSetValidatorOptions(options,validator_options->options_);
  bVar1 = Run(this,original_binary,original_binary_size,optimized_binary,options);
  spvOptimizerOptionsDestroy(options);
  return bVar1;
}

Assistant:

bool Optimizer::Run(const uint32_t* original_binary,
                    const size_t original_binary_size,
                    std::vector<uint32_t>* optimized_binary,
                    const ValidatorOptions& validator_options,
                    bool skip_validation) const {
  OptimizerOptions opt_options;
  opt_options.set_run_validator(!skip_validation);
  opt_options.set_validator_options(validator_options);
  return Run(original_binary, original_binary_size, optimized_binary,
             opt_options);
}